

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinter.cpp
# Opt level: O0

void my_do_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  void *this;
  undefined1 local_28 [8];
  Am_Value value;
  Am_Object inter;
  Am_Object *cmd_local;
  
  Am_Object::Get_Owner((Am_Object *)&value.value,(Am_Slot_Flags)cmd);
  Am_Value::Am_Value((Am_Value *)local_28);
  pAVar1 = Am_Object::Peek(cmd,0x169,0);
  Am_Value::operator=((Am_Value *)local_28,(Am_Value *)pAVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"\n+-+-+- Command ");
  poVar2 = (ostream *)operator<<(poVar2,(Am_Object *)cmd);
  poVar2 = std::operator<<(poVar2," for inter ");
  poVar2 = (ostream *)operator<<(poVar2,(Am_Object *)&value.value.bool_value);
  poVar2 = std::operator<<(poVar2," value = ");
  poVar2 = (ostream *)operator<<(poVar2,(Am_Value *)local_28);
  std::operator<<(poVar2," type ");
  Am_Print_Type((ostream *)&std::cout,local_28._0_2_);
  this = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  Am_Value::~Am_Value((Am_Value *)local_28);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, my_do, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Value value;
  value = cmd.Peek(Am_VALUE);
  cout << "\n+-+-+- Command " << cmd << " for inter " << inter
       << " value = " << value << " type ";
  Am_Print_Type(cout, value.type);
  cout << endl << flush;
}